

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O1

int KINSol(void *kinmem,N_Vector u,int strategy_in,N_Vector u_scale,N_Vector f_scale)

{
  double *pdVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  undefined4 in_register_00000014;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *module;
  char *module_00;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *module_01;
  char *module_02;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *module_03;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *module_04;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *module_05;
  char *extraout_RDX_17;
  char *module_06;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  char *extraout_RDX_20;
  char *extraout_RDX_21;
  char *extraout_RDX_22;
  char *extraout_RDX_23;
  char *extraout_RDX_24;
  char *module_07;
  char *extraout_RDX_25;
  char *module_08;
  char *extraout_RDX_26;
  char *extraout_RDX_27;
  char *module_09;
  char *extraout_RDX_28;
  char *extraout_RDX_29;
  char *extraout_RDX_30;
  char *extraout_RDX_31;
  char *module_10;
  char *extraout_RDX_32;
  char *extraout_RDX_33;
  char *extraout_RDX_34;
  char *module_11;
  char *module_12;
  char *extraout_RDX_35;
  N_Vector p_Var10;
  N_Vector p_Var11;
  int iVar12;
  KINMem pKVar13;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  double dVar20;
  sunrealtype sVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_d8;
  double local_c8;
  double local_b8;
  double local_98;
  double local_80;
  
  if (kinmem == (void *)0x0) {
    pcVar14 = "kinsol_mem = NULL illegal.";
    iVar5 = -1;
    kinmem = (KINMem)0x0;
    iVar12 = -1;
    iVar7 = 0x1fb;
  }
  else if (*(int *)((long)kinmem + 0x2a8) == 0) {
    pcVar14 = "Attempt to call before KINMalloc illegal.";
    iVar5 = -3;
    iVar12 = -3;
    iVar7 = 0x204;
  }
  else {
    *(N_Vector *)((long)kinmem + 0x108) = u;
    *(N_Vector *)((long)kinmem + 0x128) = u_scale;
    *(N_Vector *)((long)kinmem + 0x130) = f_scale;
    *(int *)((long)kinmem + 0x30) = strategy_in;
    if (strategy_in == 3) {
      if (u == (N_Vector)0x0) {
        pcVar14 = "uu = NULL illegal.";
        iVar5 = -2;
        iVar12 = -2;
        iVar7 = 0x218;
      }
      else if (*(int *)((long)kinmem + 0x60) == 0) {
        KINPrintInfo((KINMem)kinmem,3,(char *)CONCAT44(in_register_00000014,strategy_in),
                     (char *)u_scale,"scsteptol = %12.3lg, fnormtol = %12.3lg",
                     *(undefined8 *)((long)kinmem + 0x28),*(undefined8 *)((long)kinmem + 0x20));
        *(undefined8 *)((long)kinmem + 0xd0) = 0;
        *(undefined8 *)((long)kinmem + 0xd8) = 0;
        *(undefined8 *)((long)kinmem + 0xf0) = 0;
        *(undefined8 *)((long)kinmem + 0xf8) = 0;
        *(undefined8 *)((long)kinmem + 0xe0) = 0;
        *(undefined8 *)((long)kinmem + 0xe8) = 0;
        p_Var11 = *(N_Vector *)((long)kinmem + 0x148);
        *(undefined8 *)((long)kinmem + 0xd0) = 0;
        pdVar1 = (double *)((long)kinmem + 0x168);
        pcVar14 = (char *)u_scale;
        do {
          *(long *)((long)kinmem + 0xd0) = *(long *)((long)kinmem + 0xd0) + 1;
          pKVar13 = *(KINMem *)((long)kinmem + 0x108);
          iVar5 = (**(code **)((long)kinmem + 0x10))
                            (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                             *(undefined8 *)((long)kinmem + 0x18));
          *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
          if (iVar5 < 0) {
            pcVar15 = extraout_RDX_00;
            p_Var11 = (N_Vector)0xfffffff3;
            goto LAB_0010bb61;
          }
          pKVar13 = (KINMem)kinmem;
          if (*(long *)((long)kinmem + 0x1b8) == 0) {
LAB_00109f76:
            if ((*(int *)((long)kinmem + 0x164) == 0) && (*(long *)((long)kinmem + 0x1d0) == 0)) {
              N_VScale(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x118),
                       *(undefined8 *)((long)kinmem + 0x110));
              dVar23 = 1.0;
            }
            else {
              if (*(code **)((long)kinmem + 0x1d0) != (code *)0x0) {
                pcVar14 = (char *)0x0;
                iVar5 = (**(code **)((long)kinmem + 0x1d0))
                                  (*(undefined8 *)((long)kinmem + 0xd0),
                                   *(undefined8 *)((long)kinmem + 0x108),
                                   *(undefined8 *)((long)kinmem + 0x118),0,0,
                                   *(undefined8 *)((long)kinmem + 0x18),pdVar1);
                if (iVar5 == 0) {
                  if ((0.0 < *pdVar1) && (*pdVar1 <= 1.0)) goto LAB_00109fe6;
                  pcVar15 = "The damping parameter is outside of the range (0, 1].";
                  iVar5 = 0xb45;
                }
                else {
                  pcVar15 = "The damping function failed.";
                  iVar5 = 0xb3e;
                }
                pcVar14 = "KINFP";
                KINProcessError((KINMem)kinmem,-0x12,iVar5,"KINFP",
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                                ,pcVar15);
                pcVar15 = extraout_RDX_33;
                p_Var11 = (N_Vector)0xffffffee;
                goto LAB_0010bb61;
              }
LAB_00109fe6:
              N_VLinearSum(1.0 - *(double *)((long)kinmem + 0x168),
                           *(undefined8 *)((long)kinmem + 0x108),
                           *(undefined8 *)((long)kinmem + 0x118),
                           *(undefined8 *)((long)kinmem + 0x110));
              dVar23 = *(double *)((long)kinmem + 0x168);
            }
          }
          else {
            uVar9 = *(ulong *)((long)kinmem + 0x1c0);
            if (*(long *)((long)kinmem + 0xd0) <= (long)uVar9) goto LAB_00109f76;
            if ((long)uVar9 < 1) {
              uVar9 = 0;
            }
            lVar16 = *(long *)((long)kinmem + 0xd0) + ~uVar9;
            pcVar14 = *(char **)((long)kinmem + 0x110);
            uVar6 = AndersonAcc((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x118),p_Var11,
                                (N_Vector)pcVar14,*(N_Vector *)((long)kinmem + 0x108),lVar16,
                                *(sunrealtype **)((long)kinmem + 0x1a8),
                                *(sunrealtype **)((long)kinmem + 0x1a0));
            if (uVar6 != 0) {
              pcVar15 = extraout_RDX_01;
              p_Var11 = (N_Vector)(ulong)uVar6;
              goto LAB_0010bb61;
            }
            dVar23 = 1.0;
            if ((lVar16 == 0) &&
               ((*(int *)((long)kinmem + 0x1f8) != 0 ||
                (dVar23 = 1.0, *(long *)((long)kinmem + 0x1d0) != 0)))) {
              dVar23 = *pdVar1;
            }
          }
          N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,*(undefined8 *)((long)kinmem + 0x110),
                       *(undefined8 *)((long)kinmem + 0x108),p_Var11);
          N_VProd(*(undefined8 *)((long)kinmem + 0x130),p_Var11,
                  *(undefined8 *)((long)kinmem + 0x148));
          pKVar13 = *(KINMem *)((long)kinmem + 0x148);
          uVar19 = N_VMaxNorm();
          *(undefined8 *)((long)kinmem + 0x260) = uVar19;
          KINPrintInfo(pKVar13,4,module,pcVar14,"scaled f norm (for stopping) = %12.3lg");
          KINPrintInfo(pKVar13,2,module_00,pcVar14,"nni = %4ld, nfe = %6ld, fnorm = %26.16lg",
                       *(undefined8 *)((long)kinmem + 0x260),*(undefined8 *)((long)kinmem + 0xd0),
                       *(undefined8 *)((long)kinmem + 0xd8));
          lVar16 = *(long *)((long)kinmem + 0x38);
          lVar2 = *(long *)((long)kinmem + 0xd0);
          dVar20 = *(double *)((long)kinmem + 0x260);
          dVar23 = dVar23 * *(double *)((long)kinmem + 0x20);
          bVar18 = dVar23 < dVar20 && lVar2 < lVar16;
          if ((bVar18) || (pcVar15 = extraout_RDX_02, *(int *)((long)kinmem + 0x160) != 0)) {
            pKVar13 = *(KINMem *)((long)kinmem + 0x110);
            N_VScale(0x3ff0000000000000,pKVar13,*(undefined8 *)((long)kinmem + 0x108));
            pcVar15 = extraout_RDX_03;
          }
        } while (bVar18);
        pcVar14 = (char *)0xfffffffa;
        if (lVar2 < lVar16) {
          pcVar14 = (char *)0xfffffc19;
        }
        p_Var11 = (N_Vector)0x0;
        if (dVar23 < dVar20) {
          p_Var11 = (N_Vector)pcVar14;
        }
LAB_0010bb61:
        iVar5 = (int)p_Var11;
        KINPrintInfo(pKVar13,1,pcVar15,pcVar14,"Return value: %d",p_Var11);
        if (iVar5 == -6) {
          pcVar14 = "The maximum number of iterations was reached before convergence.";
          iVar12 = -6;
          iVar7 = 0x236;
        }
        else {
          if (iVar5 != -0xd) {
            return iVar5;
          }
          pcVar14 = "The system function failed in an unrecoverable manner.";
          iVar12 = -0xd;
          iVar7 = 0x232;
        }
      }
      else {
        pcVar14 = "Constraints not allowed with fixed point or Picard iterations";
        iVar5 = -2;
        iVar12 = -2;
        iVar7 = 0x220;
      }
    }
    else {
      if (u == (N_Vector)0x0) {
        pcVar14 = "uu = NULL illegal.";
        iVar7 = -2;
        iVar12 = -2;
        iVar5 = 0x584;
LAB_0010a230:
        bVar18 = false;
        KINProcessError((KINMem)kinmem,iVar12,iVar5,"KINSolInit",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                        ,pcVar14);
      }
      else {
        if (3 < (uint)strategy_in) {
          pcVar14 = "Illegal value for global strategy.";
          iVar7 = -2;
          iVar12 = -2;
          iVar5 = 0x590;
          goto LAB_0010a230;
        }
        if (u_scale == (N_Vector)0x0) {
          pcVar14 = "uscale = NULL illegal.";
          iVar7 = -2;
          iVar12 = -2;
          iVar5 = 0x597;
          goto LAB_0010a230;
        }
        dVar23 = (double)N_VMin(u_scale);
        if (dVar23 <= 0.0) {
          pcVar14 = "uscale has nonpositive elements.";
          iVar7 = -2;
          iVar12 = -2;
          iVar5 = 0x59e;
          goto LAB_0010a230;
        }
        if (*(long *)((long)kinmem + 0x130) == 0) {
          pcVar14 = "fscale = NULL illegal.";
          iVar7 = -2;
          iVar12 = -2;
          iVar5 = 0x5a5;
          goto LAB_0010a230;
        }
        dVar23 = (double)N_VMin();
        if (dVar23 <= 0.0) {
          pcVar14 = "fscale has nonpositive elements.";
          iVar7 = -2;
          iVar12 = -2;
          iVar5 = 0x5ac;
          goto LAB_0010a230;
        }
        pKVar13 = *(KINMem *)((long)kinmem + 0x140);
        if (pKVar13 != (KINMem)0x0) {
          if ((*(uint *)((long)kinmem + 0x30) & 0xfffffffe) == 2) {
            pcVar14 = "Constraints not allowed with fixed point or Picard iterations";
            iVar7 = -2;
            iVar12 = -2;
            iVar5 = 0x5b5;
          }
          else {
            *(undefined4 *)((long)kinmem + 0x60) = 1;
            if ((*(long *)((long)pKVar13->kin_uround + 0xe0) != 0) &&
               (*(long *)((long)pKVar13->kin_uround + 0xe8) != 0)) goto LAB_0010bc23;
            pcVar14 = "A required vector operation is not implemented.";
            iVar7 = -2;
            iVar12 = -2;
            iVar5 = 0x5c6;
          }
          goto LAB_0010a230;
        }
        *(undefined4 *)((long)kinmem + 0x60) = 0;
LAB_0010bc23:
        pcVar14 = extraout_RDX;
        if ((*(int *)((long)kinmem + 0x60) != 0) &&
           (iVar5 = N_VConstrMask(pKVar13,*(undefined8 *)((long)kinmem + 0x108),
                                  *(undefined8 *)((long)kinmem + 0x148)), pcVar14 = extraout_RDX_34,
           iVar5 == 0)) {
          pcVar14 = "Initial guess does NOT meet constraints.";
          iVar7 = -2;
          iVar12 = -2;
          iVar5 = 0x5d3;
          goto LAB_0010a230;
        }
        KINPrintInfo(pKVar13,3,pcVar14,(char *)u_scale,"scsteptol = %12.3lg, fnormtol = %12.3lg",
                     *(undefined8 *)((long)kinmem + 0x28));
        dVar23 = *(double *)((long)kinmem + 0x80);
        if ((dVar23 == 0.0) && (!NAN(dVar23))) {
          dVar23 = (double)N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x108),
                                      *(undefined8 *)((long)kinmem + 0x128));
          dVar23 = dVar23 * 1000.0;
        }
        *(double *)((long)kinmem + 0x78) = dVar23;
        if (dVar23 < 1.0) {
          *(undefined8 *)((long)kinmem + 0x78) = 0x3ff0000000000000;
        }
        if (*(int *)((long)kinmem + 0x250) == 0) {
          *(undefined4 *)((long)kinmem + 0x68) = 0;
        }
        else {
          bVar18 = *(int *)((long)kinmem + 0x58) != 3;
          u_scale = (N_Vector)(ulong)bVar18;
          *(uint *)((long)kinmem + 0x68) = (uint)bVar18;
          if (bVar18) {
            if (*(int *)((long)kinmem + 0x58) == 1) {
              *(undefined8 *)((long)kinmem + 0xb8) = 0x3ff9e3779b97f4a8;
            }
            *(undefined8 *)((long)kinmem + 0xa8) = 0x3fe0000000000000;
          }
          *(undefined4 *)((long)kinmem + 0x6c) = 1;
        }
        *(undefined8 *)((long)kinmem + 0xf0) = 0;
        *(undefined8 *)((long)kinmem + 0xf8) = 0;
        *(undefined8 *)((long)kinmem + 0xe0) = 0;
        *(undefined8 *)((long)kinmem + 0xe8) = 0;
        *(undefined8 *)((long)kinmem + 0xd0) = 0;
        *(undefined8 *)((long)kinmem + 0xd8) = 0;
        iVar5 = (**(code **)((long)kinmem + 0x10))
                          (*(undefined8 *)((long)kinmem + 0x108),
                           *(undefined8 *)((long)kinmem + 0x118),
                           *(undefined8 *)((long)kinmem + 0x18));
        *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
        if (iVar5 < 0) {
          pcVar14 = "The system function failed in an unrecoverable manner.";
          iVar7 = -0xd;
          iVar12 = -0xd;
          iVar5 = 0x610;
          goto LAB_0010a230;
        }
        if (iVar5 != 0) {
          pcVar14 = "The system function failed at the first call.";
          iVar7 = -0xe;
          iVar12 = -0xe;
          iVar5 = 0x616;
          goto LAB_0010a230;
        }
        pKVar13 = (KINMem)kinmem;
        sVar21 = KINScFNorm((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x118),
                            *(N_Vector *)((long)kinmem + 0x130));
        if (sVar21 <= *(double *)((long)kinmem + 0x20) * 0.01) {
          uVar19 = N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x118),
                              *(undefined8 *)((long)kinmem + 0x130));
          *(undefined8 *)((long)kinmem + 0x260) = uVar19;
          iVar7 = 1;
          bVar18 = false;
        }
        else {
          bVar18 = true;
          KINPrintInfo(pKVar13,4,module_11,(char *)u_scale,"scaled f norm (for stopping) = %12.3lg")
          ;
          if ((*(code **)((long)kinmem + 0x230) != (code *)0x0) &&
             (iVar5 = (**(code **)((long)kinmem + 0x230))(kinmem), iVar5 != 0)) {
            pcVar14 = "The linear solver\'s init routine failed.";
            iVar7 = -10;
            iVar12 = -10;
            iVar5 = 0x62d;
            goto LAB_0010a230;
          }
          pKVar13 = *(KINMem *)((long)kinmem + 0x118);
          dVar23 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)((long)kinmem + 0x130));
          *(double *)((long)kinmem + 0x260) = dVar23;
          *(double *)((long)kinmem + 0x268) = dVar23 * 0.5 * dVar23;
          *(double *)((long)kinmem + 0x280) = dVar23;
          KINPrintInfo(pKVar13,2,module_12,(char *)u_scale,
                       "nni = %4ld, nfe = %6ld, fnorm = %26.16lg",
                       *(undefined8 *)((long)kinmem + 0xd0),*(undefined8 *)((long)kinmem + 0xd8));
          iVar7 = 0;
        }
      }
      if (!bVar18) {
        return iVar7;
      }
      *(undefined8 *)((long)kinmem + 0x100) = 0;
      pcVar14 = "";
      *(undefined8 *)((long)kinmem + 200) =
           *(undefined8 *)(&DAT_0011b0c0 + (ulong)(*(int *)((long)kinmem + 0xc0) == 0) * 8);
      local_80 = 0.0;
      if ((*(int *)((long)kinmem + 0x250) != 0) &&
         (local_80 = 0.0, *(int *)((long)kinmem + 0x5c) == 0)) {
        local_80 = *(double *)((long)kinmem + 0x20) * 0.01;
      }
      *(uint *)((long)kinmem + 0x288) = -(uint)(*(double *)((long)kinmem + 0x290) == 0.0) & 1;
      if (*(int *)((long)kinmem + 0x30) != 2) {
        bVar18 = false;
        local_f0 = -1.0;
        local_f8 = -1.0;
        uVar6 = 0;
LAB_0010a747:
        *(undefined4 *)((long)kinmem + 0x70) = 0;
        *(long *)((long)kinmem + 0xd0) = *(long *)((long)kinmem + 0xd0) + 1;
        if (*(int *)((long)kinmem + 0x250) != 0) {
          dVar23 = (*(double *)((long)kinmem + 0xa8) + *(double *)((long)kinmem + 8)) *
                   *(double *)((long)kinmem + 0x260);
          *(double *)((long)kinmem + 0xa0) = dVar23;
          if (*(int *)((long)kinmem + 0x5c) == 0) {
            dVar20 = local_80;
            if (local_80 <= dVar23) {
              dVar20 = dVar23;
            }
            *(double *)((long)kinmem + 0xa0) = dVar20;
          }
        }
LAB_0010a79e:
        pKVar13 = (KINMem)kinmem;
        if (*(int *)((long)kinmem + 0x30) == 1) {
          uVar6 = KINLinSolDrv((KINMem)kinmem);
          pcVar15 = extraout_RDX_14;
          if (uVar6 == 0) {
            local_100 = (double)N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x138),
                                           *(undefined8 *)((long)kinmem + 0x128));
            dVar23 = *(double *)((long)kinmem + 0x78) / local_100;
            *(double *)((long)kinmem + 0x90) = local_100;
            if (local_100 <= *(double *)((long)kinmem + 0x78)) {
              local_d8 = 1.0;
              local_b8 = dVar23;
            }
            else {
              N_VScale(dVar23,*(undefined8 *)((long)kinmem + 0x138),
                       *(undefined8 *)((long)kinmem + 0x138));
              local_100 = *(double *)((long)kinmem + 0x78);
              *(double *)((long)kinmem + 0x90) = local_100;
              local_b8 = 1.0;
              local_d8 = dVar23;
            }
            *(undefined8 *)((long)kinmem + 0x98) = 0x3ff0000000000000;
            if ((*(int *)((long)kinmem + 0x60) == 0) ||
               (iVar5 = KINConstraint((KINMem)kinmem), iVar5 != -0x3e4)) {
LAB_0010aae0:
              iVar5 = 5;
              do {
                N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,
                             *(undefined8 *)((long)kinmem + 0x108),
                             *(undefined8 *)((long)kinmem + 0x138),
                             *(undefined8 *)((long)kinmem + 0x110));
                pKVar13 = *(KINMem *)((long)kinmem + 0x110);
                iVar7 = (**(code **)((long)kinmem + 0x10))
                                  (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                                   *(undefined8 *)((long)kinmem + 0x18));
                *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
                if (iVar7 == 0) {
                  local_f0 = (double)N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x118),
                                                *(undefined8 *)((long)kinmem + 0x130));
                  dVar23 = *(double *)((long)kinmem + 0x270) * local_d8;
                  pKVar13 = (KINMem)kinmem;
                  sVar21 = KINScSNorm((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x138),
                                      *(N_Vector *)((long)kinmem + 0x108));
                  dVar25 = *(double *)((long)kinmem + 0x28) / sVar21;
                  KINPrintInfo(pKVar13,8,module_06,pcVar14,
                               "min_lam = %11.4le, f1norm = %11.4le, pnorm = %11.4le",dVar25,
                               *(undefined8 *)((long)kinmem + 0x268),local_100);
                  dVar20 = dVar23 * 0.0001;
                  iVar5 = 0;
                  uVar29 = 0;
                  uVar30 = 0;
                  bVar17 = false;
                  pcVar15 = extraout_RDX_18;
                  local_c8 = 0.0;
                  local_e8 = 1.0;
                  local_f8 = local_f0 * 0.5 * local_f0;
                  goto LAB_0010ad0d;
                }
                bVar18 = false;
                pcVar15 = extraout_RDX_15;
                if (iVar7 < 0) goto LAB_0010b009;
                pKVar13 = *(KINMem *)((long)kinmem + 0x138);
                N_VScale(0x3fe0000000000000,pKVar13,pKVar13);
                local_d8 = local_d8 * 0.5;
                local_100 = local_100 * 0.5;
                *(double *)((long)kinmem + 0x90) = local_100;
                local_b8 = 1.0;
                iVar5 = iVar5 + -1;
              } while (iVar5 != 0);
              uVar9 = 0xfffffff1;
              pcVar15 = extraout_RDX_16;
            }
            else {
              pKVar13 = *(KINMem *)((long)kinmem + 0x138);
              N_VScale(*(undefined8 *)((long)kinmem + 0x98),pKVar13,pKVar13);
              dVar23 = *(double *)((long)kinmem + 0x98);
              local_100 = local_100 * dVar23;
              *(double *)((long)kinmem + 0x90) = local_100;
              KINPrintInfo(pKVar13,6,module_04,pcVar14,"(ivio=1) pnorm = %12.4le");
              if (*(double *)((long)kinmem + 0x28) < local_100) {
                local_d8 = local_d8 * dVar23;
                local_b8 = 1.0;
                goto LAB_0010aae0;
              }
              pKVar13 = *(KINMem *)((long)kinmem + 0x108);
              N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,pKVar13,
                           *(undefined8 *)((long)kinmem + 0x138),
                           *(undefined8 *)((long)kinmem + 0x110));
              uVar9 = 0xfffffc1b;
              bVar18 = false;
              pcVar15 = extraout_RDX_24;
            }
            goto LAB_0010b090;
          }
LAB_0010b93d:
          uVar9 = (ulong)uVar6;
        }
        else {
          if (*(int *)((long)kinmem + 0x30) != 0) {
            uVar8 = 0;
            goto LAB_0010b0cc;
          }
          uVar6 = KINLinSolDrv((KINMem)kinmem);
          pcVar15 = extraout_RDX_09;
          if (uVar6 != 0) goto LAB_0010b93d;
          pKVar13 = *(KINMem *)((long)kinmem + 0x138);
          local_100 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)((long)kinmem + 0x128));
          local_d8 = 1.0;
          pcVar15 = extraout_RDX_10;
          if (*(double *)((long)kinmem + 0x78) < local_100) {
            local_d8 = *(double *)((long)kinmem + 0x78) / local_100;
            pKVar13 = *(KINMem *)((long)kinmem + 0x138);
            N_VScale(local_d8,pKVar13,pKVar13);
            local_100 = *(double *)((long)kinmem + 0x78);
            pcVar15 = extraout_RDX_11;
          }
          KINPrintInfo(pKVar13,5,pcVar15,pcVar14,"pnorm = %12.4le",local_100);
          *(double *)((long)kinmem + 0x90) = local_100;
          *(undefined8 *)((long)kinmem + 0x98) = 0x3ff0000000000000;
          if ((*(int *)((long)kinmem + 0x60) == 0) ||
             (iVar5 = KINConstraint((KINMem)kinmem), iVar5 != -0x3e4)) {
LAB_0010a8d7:
            iVar5 = 5;
            do {
              N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,
                           *(undefined8 *)((long)kinmem + 0x108),
                           *(undefined8 *)((long)kinmem + 0x138),
                           *(undefined8 *)((long)kinmem + 0x110));
              pKVar13 = *(KINMem *)((long)kinmem + 0x110);
              iVar7 = (**(code **)((long)kinmem + 0x10))
                                (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                                 *(undefined8 *)((long)kinmem + 0x18));
              *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
              if (iVar7 == 0) {
                pKVar13 = *(KINMem *)((long)kinmem + 0x118);
                local_f0 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)((long)kinmem + 0x130));
                local_f8 = local_f0 * 0.5 * local_f0;
                *(double *)((long)kinmem + 0x270) = local_d8 * *(double *)((long)kinmem + 0x270);
                *(double *)((long)kinmem + 0x278) = local_d8 * *(double *)((long)kinmem + 0x278);
                KINPrintInfo(pKVar13,7,module_05,pcVar14,"fnorm(L2) = %20.8le");
                uVar9 = 0;
                pcVar15 = extraout_RDX_17;
                if (local_100 <= *(double *)((long)kinmem + 0x78) * 0.99) {
                  bVar18 = false;
                }
                else {
                  bVar18 = true;
                }
                goto LAB_0010b0bb;
              }
              bVar18 = false;
              if (iVar7 < 0) {
                uVar9 = 0xfffffff3;
                pcVar15 = extraout_RDX_12;
                goto LAB_0010b0bb;
              }
              local_d8 = local_d8 * 0.5;
              pKVar13 = *(KINMem *)((long)kinmem + 0x138);
              N_VScale(0x3fe0000000000000,pKVar13,pKVar13);
              local_100 = local_100 * 0.5;
              *(double *)((long)kinmem + 0x90) = local_100;
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
            uVar9 = 0xfffffff1;
            pcVar15 = extraout_RDX_13;
          }
          else {
            dVar23 = *(double *)((long)kinmem + 0x98);
            pKVar13 = *(KINMem *)((long)kinmem + 0x138);
            N_VScale(pKVar13,pKVar13);
            local_100 = local_100 * *(double *)((long)kinmem + 0x98);
            *(double *)((long)kinmem + 0x90) = local_100;
            KINPrintInfo(pKVar13,5,module_03,pcVar14,"pnorm = %12.4le");
            if (*(double *)((long)kinmem + 0x28) < local_100) {
              local_d8 = local_d8 * dVar23;
              goto LAB_0010a8d7;
            }
            pKVar13 = *(KINMem *)((long)kinmem + 0x108);
            N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,pKVar13,
                         *(undefined8 *)((long)kinmem + 0x138),*(undefined8 *)((long)kinmem + 0x110)
                        );
            uVar9 = 0xfffffc1b;
            bVar18 = false;
            pcVar15 = extraout_RDX_23;
          }
LAB_0010b0bb:
          uVar8 = (uint)uVar9;
          if ((uVar8 & 0xfffffff9) != 0xfffffff1) goto LAB_0010b0c9;
        }
        goto LAB_0010b946;
      }
      if (*(long *)((long)kinmem + 0x120) != 0) {
LAB_0010a30d:
        p_Var11 = *(N_Vector *)((long)kinmem + 0x148);
        *(undefined8 *)((long)kinmem + 0xd0) = 0;
        dVar23 = 0.0;
        if ((*(int *)((long)kinmem + 0x250) != 0) && (*(int *)((long)kinmem + 0x5c) == 0)) {
          dVar23 = *(double *)((long)kinmem + 0x20) * 0.01;
        }
        do {
          lVar16 = *(long *)((long)kinmem + 0xd0) + 1;
          *(long *)((long)kinmem + 0xd0) = lVar16;
          if (*(int *)((long)kinmem + 0x250) != 0) {
            dVar20 = (*(double *)((long)kinmem + 0xa8) + *(double *)((long)kinmem + 8)) *
                     *(double *)((long)kinmem + 0x260);
            *(double *)((long)kinmem + 0xa0) = dVar20;
            if (*(int *)((long)kinmem + 0x5c) == 0) {
              dVar25 = dVar23;
              if (dVar23 <= dVar20) {
                dVar25 = dVar20;
              }
              *(double *)((long)kinmem + 0xa0) = dVar25;
            }
          }
          if (*(long *)((long)kinmem + 0x40) <= lVar16 - *(long *)((long)kinmem + 0xe0)) {
            *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
            *(undefined4 *)((long)kinmem + 0x74) = 1;
          }
          uVar19 = *(undefined8 *)((long)kinmem + 0x120);
          uVar3 = *(undefined8 *)((long)kinmem + 0x108);
          uVar4 = *(undefined8 *)((long)kinmem + 0x118);
          while( true ) {
            *(undefined4 *)((long)kinmem + 100) = 0;
            if ((1.5 < *(double *)((long)kinmem + 200)) &&
               (*(code **)((long)kinmem + 0x238) != (code *)0x0)) {
              pKVar13 = (KINMem)kinmem;
              iVar5 = (**(code **)((long)kinmem + 0x238))();
              *(undefined4 *)((long)kinmem + 100) = 1;
              pcVar14 = *(char **)((long)kinmem + 0xd0);
              *(char **)((long)kinmem + 0xe0) = pcVar14;
              *(char **)((long)kinmem + 0xe8) = pcVar14;
              pcVar15 = extraout_RDX_04;
              if (iVar5 != 0) goto LAB_0010bbd3;
            }
            N_VScale(0xbff0000000000000,uVar4,uVar4);
            pcVar14 = (char *)((long)kinmem + 0x278);
            pKVar13 = (KINMem)kinmem;
            iVar5 = (**(code **)((long)kinmem + 0x240))
                              (kinmem,uVar19,uVar4,(N_Vector)((long)kinmem + 0x278),
                               (long)kinmem + 0x270);
            if (iVar5 == 0) break;
            p_Var10 = (N_Vector)0xfffffff3;
            pcVar15 = extraout_RDX_05;
            if (((iVar5 < 0) || (*(long *)((long)kinmem + 0x238) == 0)) ||
               (*(int *)((long)kinmem + 100) != 0)) goto LAB_0010bbd8;
            *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
          }
          N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,uVar3,uVar19,uVar19);
          if (*(long *)((long)kinmem + 0x1b8) == 0) {
LAB_0010a534:
            if ((*(int *)((long)kinmem + 0x164) == 0) && (*(long *)((long)kinmem + 0x1d0) == 0)) {
              N_VScale(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x120),
                       *(undefined8 *)((long)kinmem + 0x110));
            }
            else {
              if (*(code **)((long)kinmem + 0x1d0) != (code *)0x0) {
                pcVar14 = (char *)0x0;
                iVar5 = (**(code **)((long)kinmem + 0x1d0))
                                  (*(undefined8 *)((long)kinmem + 0xd0),
                                   *(undefined8 *)((long)kinmem + 0x108),
                                   *(undefined8 *)((long)kinmem + 0x118),0,0,
                                   *(undefined8 *)((long)kinmem + 0x18),
                                   (double *)((long)kinmem + 0x168));
                if (iVar5 == 0) {
                  dVar20 = *(double *)((long)kinmem + 0x168);
                  if ((0.0 < dVar20) && (dVar20 <= 1.0)) goto LAB_0010a5a9;
                  pcVar15 = "The damping parameter is outside of the range (0, 1].";
                  iVar5 = 0xa6d;
                }
                else {
                  pcVar15 = "The damping function failed.";
                  iVar5 = 0xa66;
                }
                pcVar14 = "KINPicardAA";
                KINProcessError((KINMem)kinmem,-0x12,iVar5,"KINPicardAA",
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                                ,pcVar15);
                pcVar15 = extraout_RDX_35;
                p_Var10 = (N_Vector)0xffffffee;
                pKVar13 = (KINMem)kinmem;
                goto LAB_0010bbd8;
              }
LAB_0010a5a9:
              N_VLinearSum(1.0 - *(double *)((long)kinmem + 0x168),
                           *(undefined8 *)((long)kinmem + 0x108),
                           *(undefined8 *)((long)kinmem + 0x120),
                           *(undefined8 *)((long)kinmem + 0x110));
            }
          }
          else {
            uVar9 = *(ulong *)((long)kinmem + 0x1c0);
            if (*(long *)((long)kinmem + 0xd0) <= (long)uVar9) goto LAB_0010a534;
            if ((long)uVar9 < 1) {
              uVar9 = 0;
            }
            pcVar14 = *(char **)((long)kinmem + 0x110);
            pKVar13 = (KINMem)kinmem;
            uVar6 = AndersonAcc((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x120),p_Var11,
                                (N_Vector)pcVar14,*(N_Vector *)((long)kinmem + 0x108),
                                *(long *)((long)kinmem + 0xd0) + ~uVar9,
                                *(sunrealtype **)((long)kinmem + 0x1a8),
                                *(sunrealtype **)((long)kinmem + 0x1a0));
            if (uVar6 != 0) {
              pcVar15 = extraout_RDX_06;
              p_Var10 = (N_Vector)(ulong)uVar6;
              goto LAB_0010bbd8;
            }
          }
          pKVar13 = *(KINMem *)((long)kinmem + 0x110);
          iVar5 = (**(code **)((long)kinmem + 0x10))
                            (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                             *(undefined8 *)((long)kinmem + 0x18));
          *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
          pcVar15 = extraout_RDX_07;
          if (iVar5 < 0) {
LAB_0010bbd3:
            p_Var10 = (N_Vector)0xfffffff3;
            goto LAB_0010bbd8;
          }
          N_VProd(*(undefined8 *)((long)kinmem + 0x130),*(undefined8 *)((long)kinmem + 0x118),
                  *(undefined8 *)((long)kinmem + 0x148));
          pKVar13 = *(KINMem *)((long)kinmem + 0x148);
          uVar19 = N_VMaxNorm();
          *(undefined8 *)((long)kinmem + 0x260) = uVar19;
          KINPrintInfo(pKVar13,4,module_01,pcVar14,"scaled f norm (for stopping) = %12.3lg");
          KINPrintInfo(pKVar13,2,module_02,pcVar14,"nni = %4ld, nfe = %6ld, fnorm = %26.16lg",
                       *(undefined8 *)((long)kinmem + 0x260),*(undefined8 *)((long)kinmem + 0xd0),
                       *(undefined8 *)((long)kinmem + 0xd8));
          lVar16 = *(long *)((long)kinmem + 0xd0);
          lVar2 = *(long *)((long)kinmem + 0x38);
          dVar20 = *(double *)((long)kinmem + 0x260);
          dVar25 = *(double *)((long)kinmem + 0x20);
          pKVar13 = *(KINMem *)((long)kinmem + 0x110);
          N_VScale(0x3ff0000000000000,pKVar13,*(undefined8 *)((long)kinmem + 0x108));
          if (dVar20 <= dVar25 || lVar2 <= lVar16) {
            pcVar14 = (char *)0xfffffffa;
            if (lVar16 < lVar2) {
              pcVar14 = (char *)0xfffffc19;
            }
            pcVar15 = extraout_RDX_08;
            p_Var10 = (N_Vector)0x0;
            if (dVar25 < dVar20) {
              p_Var10 = (N_Vector)pcVar14;
            }
LAB_0010bbd8:
            KINPrintInfo(pKVar13,1,pcVar15,pcVar14,"Return value: %d",p_Var10);
            return (int)p_Var10;
          }
          if (*(int *)((long)kinmem + 0x68) != 0) {
            sVar21 = (sunrealtype)
                     N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x118),
                                *(undefined8 *)((long)kinmem + 0x130));
            KINForcingTerm((KINMem)kinmem,sVar21);
          }
        } while( true );
      }
      lVar16 = N_VClone(*(undefined8 *)((long)kinmem + 0x110));
      *(long *)((long)kinmem + 0x120) = lVar16;
      if (lVar16 != 0) {
        *(long *)((long)kinmem + 0x220) =
             *(long *)((long)kinmem + 0x220) + *(long *)((long)kinmem + 0x210);
        *(long *)((long)kinmem + 0x228) =
             *(long *)((long)kinmem + 0x228) + *(long *)((long)kinmem + 0x218);
        goto LAB_0010a30d;
      }
      pcVar14 = "A memory request failed.";
      iVar5 = -4;
      iVar12 = -4;
      iVar7 = 0x268;
    }
  }
  goto LAB_00109dcf;
  while( true ) {
    if (bVar17) {
      dVar24 = (local_f8 - dVar22) - local_e8 * dVar23;
      dVar22 = ((double)CONCAT44(uVar30,uVar29) - dVar22) - local_c8 * dVar23;
      dVar28 = 1.0 / (local_e8 - local_c8);
      dVar26 = ((1.0 / (local_e8 * local_e8)) * dVar24 + (-1.0 / (local_c8 * local_c8)) * dVar22) *
               dVar28;
      dVar28 = dVar28 * ((local_e8 / (local_c8 * local_c8)) * dVar22 -
                        (local_c8 / (local_e8 * local_e8)) * dVar24);
      dVar22 = dVar26 * 3.0;
      if (*(double *)((long)kinmem + 8) <= ABS(dVar26)) {
        dVar24 = dVar28 * dVar28 - dVar23 * dVar22;
        dVar26 = 0.0;
        if (0.0 < dVar24) {
          if (dVar24 < 0.0) {
            dVar26 = sqrt(dVar24);
          }
          else {
            dVar26 = SQRT(dVar24);
          }
        }
        dVar22 = (dVar26 - dVar28) / dVar22;
      }
      else {
        dVar22 = -dVar23 / (dVar28 + dVar28);
      }
    }
    else {
      dVar22 = (local_f8 - dVar22) - dVar23;
      dVar22 = -dVar23 / (dVar22 + dVar22);
    }
    dVar26 = local_e8 * 0.5;
    if (dVar22 <= local_e8 * 0.5) {
      dVar26 = dVar22;
    }
    dVar22 = local_e8 * 0.1;
    if (local_e8 * 0.1 <= dVar26) {
      dVar22 = dVar26;
    }
    N_VLinearSum(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x108),
                 *(undefined8 *)((long)kinmem + 0x138),*(undefined8 *)((long)kinmem + 0x110));
    pKVar13 = *(KINMem *)((long)kinmem + 0x110);
    iVar7 = (**(code **)((long)kinmem + 0x10))
                      (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                       *(undefined8 *)((long)kinmem + 0x18));
    *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
    bVar18 = false;
    pcVar15 = extraout_RDX_20;
    if (iVar7 != 0) goto LAB_0010b009;
    iVar5 = iVar5 + 1;
    pKVar13 = *(KINMem *)((long)kinmem + 0x118);
    local_f0 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)((long)kinmem + 0x130));
    dVar26 = local_f0 * 0.5 * local_f0;
    bVar17 = true;
    uVar29 = SUB84(local_f8,0);
    uVar30 = (undefined4)((ulong)local_f8 >> 0x20);
    pcVar15 = extraout_RDX_21;
    local_c8 = local_e8;
    local_e8 = dVar22;
    local_f8 = dVar26;
    if (dVar22 < dVar25) break;
LAB_0010ad0d:
    dVar26 = dVar20 * local_e8 + *(double *)((long)kinmem + 0x268);
    KINPrintInfo(pKVar13,9,pcVar15,pcVar14,
                 "fnorm = %15.8le, f1norm = %15.8le, alpha_cond = %15.8le,lam = %15.8le");
    dVar22 = *(double *)((long)kinmem + 0x268);
    if (local_f8 <= dVar26) {
      dVar23 = dVar23 * 0.9;
      pcVar15 = extraout_RDX_19;
      if (dVar23 * local_e8 + dVar22 <= local_f8) goto LAB_0010b791;
      if (((local_e8 != 1.0) || (NAN(local_e8))) || (*(double *)((long)kinmem + 0x78) <= local_100))
      goto LAB_0010b51a;
      goto LAB_0010b2f5;
    }
  }
  pKVar13 = *(KINMem *)((long)kinmem + 0x108);
  N_VScale(0x3ff0000000000000,pKVar13,*(undefined8 *)((long)kinmem + 0x110));
  uVar9 = 0xfffffc1b;
  pcVar15 = extraout_RDX_22;
  goto LAB_0010b090;
  while( true ) {
    iVar5 = iVar5 + 1;
    pKVar13 = *(KINMem *)((long)kinmem + 0x118);
    local_f0 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)((long)kinmem + 0x130));
    local_f8 = local_f0 * 0.5 * local_f0;
    dVar24 = *(double *)((long)kinmem + 0x268);
    KINPrintInfo(pKVar13,10,module_08,pcVar14,"f1norm = %15.8le, beta_cond = %15.8le, lam = %15.8le"
                 ,local_f8);
    dVar26 = dVar20 * local_e8 + dVar24;
    pcVar15 = extraout_RDX_26;
    if (((local_b8 <= dVar22) || (dVar26 < local_f8)) || (dVar23 * local_e8 + dVar24 <= local_f8))
    break;
LAB_0010b2f5:
    local_c8 = local_e8;
    dVar22 = local_c8 + local_c8;
    local_e8 = dVar22;
    if (local_b8 <= dVar22) {
      local_e8 = local_b8;
    }
    N_VLinearSum(*(undefined8 *)((long)kinmem + 0x108),*(undefined8 *)((long)kinmem + 0x138),
                 *(undefined8 *)((long)kinmem + 0x110));
    pKVar13 = *(KINMem *)((long)kinmem + 0x110);
    iVar7 = (**(code **)((long)kinmem + 0x10))
                      (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                       *(undefined8 *)((long)kinmem + 0x18));
    *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
    if (iVar7 != 0) {
      uVar9 = 0xfffffff3;
      pcVar15 = extraout_RDX_25;
      goto LAB_0010b804;
    }
  }
LAB_0010b51a:
  if ((local_e8 < 1.0) || ((1.0 < local_e8 && (dVar26 < local_f8)))) {
    local_98 = local_e8;
    if (local_c8 <= local_e8) {
      local_98 = local_c8;
    }
    dVar22 = ABS(local_c8 - local_e8);
    do {
      iVar5 = iVar5 + 1;
      dVar26 = dVar22 * 0.5;
      local_e8 = local_98 + dVar26;
      N_VLinearSum(*(undefined8 *)((long)kinmem + 0x108),*(undefined8 *)((long)kinmem + 0x138),
                   *(undefined8 *)((long)kinmem + 0x110));
      pKVar13 = *(KINMem *)((long)kinmem + 0x110);
      iVar7 = (**(code **)((long)kinmem + 0x10))
                        (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                         *(undefined8 *)((long)kinmem + 0x18));
      *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
      uVar9 = 0xfffffff3;
      bVar18 = false;
      pcVar15 = extraout_RDX_27;
      if (iVar7 != 0) goto LAB_0010b090;
      pKVar13 = *(KINMem *)((long)kinmem + 0x118);
      local_f0 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)((long)kinmem + 0x130));
      local_f8 = local_f0 * 0.5 * local_f0;
      dVar28 = dVar20 * local_e8 + *(double *)((long)kinmem + 0x268);
      dVar27 = dVar23 * local_e8 + *(double *)((long)kinmem + 0x268);
      KINPrintInfo(pKVar13,0xb,module_09,pcVar14,
                   "f1norm = %15.8le, alpha_cond = %15.8le, beta_cond = %15.8le, lam = %15.8le",
                   local_f8,dVar28);
      dVar24 = dVar26;
      if ((local_f8 <= dVar28) && (dVar24 = dVar22, local_f8 < dVar27)) {
        dVar24 = dVar22 - dVar26;
        local_98 = local_e8;
      }
      dVar22 = dVar24;
    } while ((dVar28 < local_f8) || ((local_f8 < dVar27 && (dVar25 <= dVar24))));
    pcVar15 = extraout_RDX_28;
    if (local_f8 < dVar27) {
      N_VLinearSum(0x3ff0000000000000,local_98,*(undefined8 *)((long)kinmem + 0x108),
                   *(undefined8 *)((long)kinmem + 0x138),*(undefined8 *)((long)kinmem + 0x110));
      pKVar13 = *(KINMem *)((long)kinmem + 0x110);
      iVar7 = (**(code **)((long)kinmem + 0x10))
                        (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                         *(undefined8 *)((long)kinmem + 0x18));
      *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
      pcVar15 = extraout_RDX_29;
      if (iVar7 != 0) goto LAB_0010b090;
      pKVar13 = *(KINMem *)((long)kinmem + 0x118);
      local_f0 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)((long)kinmem + 0x130));
      local_f8 = local_f0 * 0.5 * local_f0;
      *(long *)((long)kinmem + 0xf0) = *(long *)((long)kinmem + 0xf0) + 1;
      pcVar15 = extraout_RDX_30;
    }
  }
LAB_0010b791:
  *(long *)((long)kinmem + 0xf8) = *(long *)((long)kinmem + 0xf8) + (long)iVar5;
  uVar9 = 0;
  KINPrintInfo(pKVar13,0xc,pcVar15,pcVar14,"no. of lambda adjustments = %ld");
  *(double *)((long)kinmem + 0x270) = local_d8 * local_e8 * *(double *)((long)kinmem + 0x270);
  *(double *)((long)kinmem + 0x278) = local_d8 * local_e8 * *(double *)((long)kinmem + 0x278);
  pcVar15 = extraout_RDX_31;
  if (local_100 * local_e8 <= *(double *)((long)kinmem + 0x78) * 0.99) {
LAB_0010b804:
    bVar18 = false;
  }
  else {
    bVar18 = true;
  }
LAB_0010b090:
  uVar8 = (uint)uVar9;
  if ((uVar8 & 0xfffffff9) == 0xfffffff1) goto LAB_0010b946;
  if (*(long *)((long)kinmem + 0x50) < *(long *)((long)kinmem + 0xf0)) {
    uVar9 = 0xfffffff8;
    goto LAB_0010b946;
  }
LAB_0010b0c9:
  uVar6 = 0;
LAB_0010b0cc:
  if ((*(uint *)((long)kinmem + 0x30) & 0xfffffffe) == 2) goto LAB_0010b8d4;
  if (*(int *)((long)kinmem + 0x68) != 0) {
    KINForcingTerm((KINMem)kinmem,local_f0);
  }
  *(double *)((long)kinmem + 0x260) = local_f0;
  if (uVar8 == 0xfffffc1b) {
    if ((*(long *)((long)kinmem + 0x238) == 0) || (*(int *)((long)kinmem + 100) != 0)) {
      uVar6 = 0xfffffffb;
      if (*(int *)((long)kinmem + 0x30) == 0) {
        uVar6 = 2;
      }
    }
    else {
      *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
      uVar6 = 0xfffffc1a;
    }
  }
  else {
    N_VProd(*(undefined8 *)((long)kinmem + 0x130),*(undefined8 *)((long)kinmem + 0x118),
            *(undefined8 *)((long)kinmem + 0x148));
    pKVar13 = *(KINMem *)((long)kinmem + 0x148);
    dVar23 = (double)N_VMaxNorm();
    KINPrintInfo(pKVar13,4,module_07,pcVar14,"scaled f norm (for stopping) = %12.3lg");
    uVar6 = 0;
    if (*(double *)((long)kinmem + 0x20) < dVar23) {
      p_Var11 = *(N_Vector *)((long)kinmem + 0x138);
      N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,*(undefined8 *)((long)kinmem + 0x110),
                   *(undefined8 *)((long)kinmem + 0x108),p_Var11);
      sVar21 = KINScSNorm((KINMem)kinmem,p_Var11,*(N_Vector *)((long)kinmem + 0x110));
      if (sVar21 <= *(double *)((long)kinmem + 0x28)) {
        uVar6 = 2;
        if ((*(long *)((long)kinmem + 0x238) == 0) || (*(int *)((long)kinmem + 100) != 0))
        goto LAB_0010b264;
        *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
      }
      else {
        lVar16 = *(long *)((long)kinmem + 0xd0);
        uVar6 = 0xfffffffa;
        if (*(long *)((long)kinmem + 0x38) <= lVar16) goto LAB_0010b264;
        if (bVar18) {
          pcVar14 = (char *)(*(long *)((long)kinmem + 0x100) + 1);
        }
        else {
          pcVar14 = (char *)0x0;
        }
        *(char **)((long)kinmem + 0x100) = pcVar14;
        uVar6 = 0xfffffff9;
        if (pcVar14 == (char *)0x5) goto LAB_0010b264;
        if (*(int *)((long)kinmem + 0x250) == 0) {
          uVar6 = 0xfffffc19;
          if (*(int *)((long)kinmem + 0x6c) == 0) {
            pcVar14 = (char *)(lVar16 - *(long *)((long)kinmem + 0xe8));
            if ((long)pcVar14 < *(long *)((long)kinmem + 0x48)) {
              if ((*(int *)((long)kinmem + 0x70) != 0) || (*(int *)((long)kinmem + 0x74) != 0)) {
                *(undefined8 *)((long)kinmem + 0x280) = *(undefined8 *)((long)kinmem + 0x260);
              }
              if (*(int *)((long)kinmem + 0x74) != 0) {
                *(undefined4 *)((long)kinmem + 0x74) = 0;
              }
            }
            else {
              *(long *)((long)kinmem + 0xe8) = lVar16;
              if (*(int *)((long)kinmem + 0x288) != 0) {
                dVar20 = *(double *)((long)kinmem + 0x260) / *(double *)((long)kinmem + 0x20) + -1.0
                ;
                dVar23 = 0.0;
                if (0.0 <= dVar20) {
                  dVar23 = dVar20;
                }
                if (dVar23 <= 12.0) {
                  dVar25 = *(double *)((long)kinmem + 0x298);
                  dVar22 = exp(dVar23);
                  dVar20 = *(double *)((long)kinmem + 0x2a0);
                  if (dVar22 * dVar25 < dVar20) {
                    dVar25 = *(double *)((long)kinmem + 0x298);
                    dVar20 = exp(dVar23);
                    dVar20 = dVar20 * dVar25;
                  }
                }
                else {
                  dVar20 = *(double *)((long)kinmem + 0x2a0);
                }
                *(double *)((long)kinmem + 0x290) = dVar20;
              }
              if (*(double *)((long)kinmem + 0x290) * *(double *)((long)kinmem + 0x280) <
                  *(double *)((long)kinmem + 0x260)) {
                if ((*(long *)((long)kinmem + 0x238) != 0) && (*(int *)((long)kinmem + 100) == 0)) {
                  *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
                }
                goto LAB_0010b264;
              }
              *(double *)((long)kinmem + 0x280) = *(double *)((long)kinmem + 0x260);
            }
            *(undefined8 *)((long)kinmem + 200) = 0x3ff0000000000000;
          }
          goto LAB_0010b264;
        }
        *(sunrealtype *)((long)kinmem + 200) = sVar21;
      }
      uVar6 = 0xfffffc19;
    }
  }
LAB_0010b264:
  if (uVar6 != 0xfffffc1a) goto LAB_0010b8d4;
  *(undefined4 *)((long)kinmem + 0x70) = 1;
  uVar6 = 0xfffffc1a;
  goto LAB_0010a79e;
LAB_0010b009:
  bVar18 = false;
  uVar9 = 0xfffffff3;
  goto LAB_0010b090;
LAB_0010b8d4:
  uVar9 = (ulong)uVar6;
  pKVar13 = *(KINMem *)((long)kinmem + 0x110);
  N_VScale(0x3ff0000000000000,pKVar13,*(undefined8 *)((long)kinmem + 0x108));
  *(double *)((long)kinmem + 0x268) = local_f8;
  KINPrintInfo(pKVar13,2,module_10,pcVar14,"nni = %4ld, nfe = %6ld, fnorm = %26.16lg",
               *(undefined8 *)((long)kinmem + 0x260),*(undefined8 *)((long)kinmem + 0xd0),
               *(undefined8 *)((long)kinmem + 0xd8));
  bVar17 = uVar6 != 0xfffffc19;
  pcVar15 = extraout_RDX_32;
  uVar6 = 0xfffffc19;
  if (bVar17) goto LAB_0010b946;
  goto LAB_0010a747;
LAB_0010b946:
  KINPrintInfo(pKVar13,1,pcVar15,pcVar14,"Return value: %d",uVar9);
  iVar5 = (int)uVar9;
  switch(iVar5) {
  case -0xf:
    pcVar14 = "Unable to correct repeated recoverable system function errors.";
    iVar12 = -0xf;
    iVar7 = 0x2e6;
    break;
  default:
    goto switchD_0010b976_caseD_fffffff2;
  case -0xd:
    pcVar14 = "The system function failed in an unrecoverable manner.";
    iVar12 = -0xd;
    iVar7 = 0x2e2;
    break;
  case -0xc:
    pcVar14 = "The linear solver\'s solve function failed in an unrecoverable manner.";
    iVar12 = -0xc;
    iVar7 = 0x2ee;
    break;
  case -0xb:
    pcVar14 = "The linear solver\'s setup function failed in an unrecoverable manner.";
    iVar12 = -0xb;
    iVar7 = 0x2ea;
    break;
  case -9:
    pcVar14 = 
    "The linear solver\'s solve function failed recoverably, but the Jacobian data is already current."
    ;
    iVar12 = -9;
    iVar7 = 0x2f2;
    break;
  case -8:
    pcVar14 = 
    "The line search algorithm was unable to satisfy the beta-condition for nbcfails iterations.";
    iVar12 = -8;
    iVar7 = 0x2fa;
    break;
  case -7:
    pcVar14 = "Five consecutive steps have been taken that satisfy a scaled step length test.";
    iVar12 = -7;
    iVar7 = 0x302;
    break;
  case -6:
    pcVar14 = "The maximum number of iterations was reached before convergence.";
    iVar12 = -6;
    iVar7 = 0x2fe;
    break;
  case -5:
    pcVar14 = 
    "The line search algorithm was unable to find an iterate sufficiently distinct from the current iterate."
    ;
    iVar12 = -5;
    iVar7 = 0x2f6;
  }
LAB_00109dcf:
  KINProcessError((KINMem)kinmem,iVar12,iVar7,"KINSol",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                  ,pcVar14);
switchD_0010b976_caseD_fffffff2:
  return iVar5;
}

Assistant:

int KINSol(void* kinmem, N_Vector u, int strategy_in, N_Vector u_scale,
           N_Vector f_scale)
{
  sunrealtype fnormp, f1normp, epsmin;
  KINMem kin_mem;
  int ret, sflag;
  sunbooleantype maxStepTaken;

  /* initialize to avoid compiler warning messages */

  maxStepTaken = SUNFALSE;
  f1normp = fnormp = -ONE;

  /* initialize epsmin to avoid compiler warning message */

  epsmin = ZERO;

  /* check for kinmem non-NULL */

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }
  kin_mem = (KINMem)kinmem;

  SUNDIALS_MARK_FUNCTION_BEGIN(KIN_PROFILER);

  if (kin_mem->kin_MallocDone == SUNFALSE)
  {
    KINProcessError(kin_mem, KIN_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_NO_MALLOC);
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (KIN_NO_MALLOC);
  }

  /* load input arguments */

  kin_mem->kin_uu             = u;
  kin_mem->kin_uscale         = u_scale;
  kin_mem->kin_fscale         = f_scale;
  kin_mem->kin_globalstrategy = strategy_in;

  /* CSW:
     Call fixed point solver if requested.  Note that this should probably
     be forked off to a FPSOL solver instead of kinsol in the future. */
  if (kin_mem->kin_globalstrategy == KIN_FP)
  {
    if (kin_mem->kin_uu == NULL)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_UU_NULL);
      SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
      return (KIN_ILL_INPUT);
    }

    if (kin_mem->kin_constraintsSet != SUNFALSE)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_CONSTRAINTS_NOTOK);
      SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
      return (KIN_ILL_INPUT);
    }

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
    KINPrintInfo(kin_mem, PRNT_TOL, "KINSOL", __func__, INFO_TOL,
                 kin_mem->kin_scsteptol, kin_mem->kin_fnormtol);
#endif

    kin_mem->kin_nfe = kin_mem->kin_nnilset = kin_mem->kin_nnilset_sub =
      kin_mem->kin_nni = kin_mem->kin_nbcf = kin_mem->kin_nbktrk = 0;
    ret = KINFP(kin_mem);

    switch (ret)
    {
    case KIN_SYSFUNC_FAIL:
      KINProcessError(kin_mem, KIN_SYSFUNC_FAIL, __LINE__, __func__, __FILE__,
                      MSG_SYSFUNC_FAILED);
      break;
    case KIN_MAXITER_REACHED:
      KINProcessError(kin_mem, KIN_MAXITER_REACHED, __LINE__, __func__,
                      __FILE__, MSG_MAXITER_REACHED);
      break;
    }

    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (ret);
  }

  /* initialize solver */
  ret = KINSolInit(kin_mem);
  if (ret != KIN_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (ret);
  }

  kin_mem->kin_ncscmx = 0;

  /* Note: The following logic allows the choice of whether or not
     to force a call to the linear solver setup upon a given call to
     KINSol */

  if (kin_mem->kin_noInitSetup) { kin_mem->kin_sthrsh = ONE; }
  else { kin_mem->kin_sthrsh = TWO; }

  /* if eps is to be bounded from below, set the bound */

  if (kin_mem->kin_inexact_ls && !(kin_mem->kin_noMinEps))
  {
    epsmin = POINT01 * kin_mem->kin_fnormtol;
  }

  /* if omega is zero at this point, make sure it will be evaluated
     at each iteration based on the provided min/max bounds and the
     current function norm. */
  if (kin_mem->kin_omega == ZERO) { kin_mem->kin_eval_omega = SUNTRUE; }
  else { kin_mem->kin_eval_omega = SUNFALSE; }

  /* CSW:
     Call fixed point solver for Picard method if requested.
     Note that this should probably be forked off to a part of an
     FPSOL solver instead of kinsol in the future. */
  if (kin_mem->kin_globalstrategy == KIN_PICARD)
  {
    if (kin_mem->kin_gval == NULL)
    {
      kin_mem->kin_gval = N_VClone(kin_mem->kin_unew);
      if (kin_mem->kin_gval == NULL)
      {
        KINProcessError(kin_mem, KIN_MEM_FAIL, __LINE__, __func__, __FILE__,
                        MSG_MEM_FAIL);
        SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
        return (KIN_MEM_FAIL);
      }
      kin_mem->kin_liw += kin_mem->kin_liw1;
      kin_mem->kin_lrw += kin_mem->kin_lrw1;
    }
    ret = KINPicardAA(kin_mem);

    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (ret);
  }

  for (;;)
  {
    kin_mem->kin_retry_nni = SUNFALSE;

    kin_mem->kin_nni++;

    /* calculate the epsilon (stopping criteria for iterative linear solver)
       for this iteration based on eta from the routine KINForcingTerm */

    if (kin_mem->kin_inexact_ls)
    {
      kin_mem->kin_eps = (kin_mem->kin_eta + kin_mem->kin_uround) *
                         kin_mem->kin_fnorm;
      if (!(kin_mem->kin_noMinEps))
      {
        kin_mem->kin_eps = SUNMAX(epsmin, kin_mem->kin_eps);
      }
    }

  repeat_nni:

    /* call the appropriate routine to calculate an acceptable step pp */

    sflag = 0;

    if (kin_mem->kin_globalstrategy == KIN_NONE)
    {
      /* Full Newton Step*/

      /* call KINLinSolDrv to calculate the (approximate) Newton step, pp */
      ret = KINLinSolDrv(kin_mem);
      if (ret != KIN_SUCCESS) { break; }

      sflag = KINFullNewton(kin_mem, &fnormp, &f1normp, &maxStepTaken);

      /* if sysfunc failed unrecoverably, stop */
      if ((sflag == KIN_SYSFUNC_FAIL) || (sflag == KIN_REPTD_SYSFUNC_ERR))
      {
        ret = sflag;
        break;
      }
    }
    else if (kin_mem->kin_globalstrategy == KIN_LINESEARCH)
    {
      /* Line Search */

      /* call KINLinSolDrv to calculate the (approximate) Newton step, pp */
      ret = KINLinSolDrv(kin_mem);
      if (ret != KIN_SUCCESS) { break; }

      sflag = KINLineSearch(kin_mem, &fnormp, &f1normp, &maxStepTaken);

      /* if sysfunc failed unrecoverably, stop */
      if ((sflag == KIN_SYSFUNC_FAIL) || (sflag == KIN_REPTD_SYSFUNC_ERR))
      {
        ret = sflag;
        break;
      }

      /* if too many beta condition failures, then stop iteration */
      if (kin_mem->kin_nbcf > kin_mem->kin_mxnbcf)
      {
        ret = KIN_LINESEARCH_BCFAIL;
        break;
      }
    }

    if ((kin_mem->kin_globalstrategy != KIN_PICARD) &&
        (kin_mem->kin_globalstrategy != KIN_FP))
    {
      /* evaluate eta by calling the forcing term routine */
      if (kin_mem->kin_callForcingTerm) { KINForcingTerm(kin_mem, fnormp); }

      kin_mem->kin_fnorm = fnormp;

      /* call KINStop to check if tolerances where met by this iteration */
      ret = KINStop(kin_mem, maxStepTaken, sflag);

      if (ret == RETRY_ITERATION)
      {
        kin_mem->kin_retry_nni = SUNTRUE;
        goto repeat_nni;
      }
    }

    /* update uu after the iteration */
    N_VScale(ONE, kin_mem->kin_unew, kin_mem->kin_uu);

    kin_mem->kin_f1norm = f1normp;

    /* print the current nni, fnorm, and nfe values */

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
    KINPrintInfo(kin_mem, PRNT_NNI, "KINSOL", __func__, INFO_NNI,
                 kin_mem->kin_nni, kin_mem->kin_nfe, kin_mem->kin_fnorm);
#endif

    if (ret != CONTINUE_ITERATIONS) { break; }

  } /* end of loop; return */

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
  KINPrintInfo(kin_mem, PRNT_RETVAL, "KINSOL", __func__, INFO_RETVAL, ret);
#endif

  switch (ret)
  {
  case KIN_SYSFUNC_FAIL:
    KINProcessError(kin_mem, KIN_SYSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    MSG_SYSFUNC_FAILED);
    break;
  case KIN_REPTD_SYSFUNC_ERR:
    KINProcessError(kin_mem, KIN_REPTD_SYSFUNC_ERR, __LINE__, __func__,
                    __FILE__, MSG_SYSFUNC_REPTD);
    break;
  case KIN_LSETUP_FAIL:
    KINProcessError(kin_mem, KIN_LSETUP_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LSETUP_FAILED);
    break;
  case KIN_LSOLVE_FAIL:
    KINProcessError(kin_mem, KIN_LSOLVE_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LSOLVE_FAILED);
    break;
  case KIN_LINSOLV_NO_RECOVERY:
    KINProcessError(kin_mem, KIN_LINSOLV_NO_RECOVERY, __LINE__, __func__,
                    __FILE__, MSG_LINSOLV_NO_RECOVERY);
    break;
  case KIN_LINESEARCH_NONCONV:
    KINProcessError(kin_mem, KIN_LINESEARCH_NONCONV, __LINE__, __func__,
                    __FILE__, MSG_LINESEARCH_NONCONV);
    break;
  case KIN_LINESEARCH_BCFAIL:
    KINProcessError(kin_mem, KIN_LINESEARCH_BCFAIL, __LINE__, __func__,
                    __FILE__, MSG_LINESEARCH_BCFAIL);
    break;
  case KIN_MAXITER_REACHED:
    KINProcessError(kin_mem, KIN_MAXITER_REACHED, __LINE__, __func__, __FILE__,
                    MSG_MAXITER_REACHED);
    break;
  case KIN_MXNEWT_5X_EXCEEDED:
    KINProcessError(kin_mem, KIN_MXNEWT_5X_EXCEEDED, __LINE__, __func__,
                    __FILE__, MSG_MXNEWT_5X_EXCEEDED);
    break;
  }

  SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
  return (ret);
}